

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O2

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,int labelwidth,int entrywidth)

{
  cmCursesLabelWidget *pcVar1;
  cmCursesStringWidget *this_00;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&this->Key,(string *)key);
  this->LabelWidth = labelwidth;
  this->EntryWidth = entrywidth;
  pcVar1 = (cmCursesLabelWidget *)operator_new(0x40);
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar1,labelwidth,1,1,1,key);
  this->Label = pcVar1;
  pcVar1 = (cmCursesLabelWidget *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_48," ",&local_49);
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar1,1,1,1,1,&local_48);
  this->IsNewLabel = pcVar1;
  std::__cxx11::string::~string((string *)&local_48);
  this->Entry = (cmCursesWidget *)0x0;
  this_00 = (cmCursesStringWidget *)operator_new(0x50);
  cmCursesStringWidget::cmCursesStringWidget(this_00,this->EntryWidth,1,1,1);
  this->Entry = (cmCursesWidget *)this_00;
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
                                                        const std::string& key,
                                                        int labelwidth,
                                                        int entrywidth) :
  Key(key), LabelWidth(labelwidth), EntryWidth(entrywidth)
{
  this->Label = new cmCursesLabelWidget(this->LabelWidth, 1, 1, 1, key);
  this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, " ");
  this->Entry = 0;
  this->Entry = new cmCursesStringWidget(this->EntryWidth, 1, 1, 1);
}